

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void GiveInventory(AActor *activator,char *type,int amount)

{
  int iVar1;
  PClassActor *pPVar2;
  PClassActor *pPVar3;
  char *format;
  int i;
  char *name;
  long lVar4;
  undefined8 *puVar5;
  
  if (type != (char *)0x0 && 0 < amount) {
    iVar1 = strcasecmp(type,"Armor");
    name = "BasicArmorPickup";
    if (iVar1 != 0) {
      name = type;
    }
    pPVar2 = PClass::FindActor(name);
    if (pPVar2 == (PClassActor *)0x0) {
      format = "ACS: I don\'t know what %s is.\n";
LAB_005131f9:
      Printf(format,name);
      return;
    }
    pPVar3 = pPVar2;
    if (pPVar2 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar3 = (PClassActor *)(pPVar3->super_PClass).ParentClass;
        if (pPVar3 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar3 != (PClassActor *)0x0);
      if (pPVar3 == (PClassActor *)0x0) {
        format = "ACS: %s is not an inventory item.\n";
        goto LAB_005131f9;
      }
    }
    if (activator != (AActor *)0x0) {
      (*(activator->super_DThinker).super_DObject._vptr_DObject[0x1a])
                (activator,pPVar2,(ulong)(uint)amount,0);
      return;
    }
    puVar5 = &players;
    lVar4 = 0;
    do {
      if (playeringame[lVar4] == true) {
        (**(code **)(*(long *)*puVar5 + 0xd0))((long *)*puVar5,pPVar2,amount,0);
      }
      lVar4 = lVar4 + 1;
      puVar5 = puVar5 + 0x54;
    } while (lVar4 != 8);
  }
  return;
}

Assistant:

static void GiveInventory (AActor *activator, const char *type, int amount)
{
	PClassActor *info;

	if (amount <= 0 || type == NULL)
	{
		return;
	}
	if (stricmp (type, "Armor") == 0)
	{
		type = "BasicArmorPickup";
	}
	info = PClass::FindActor(type);
	if (info == NULL)
	{
		Printf ("ACS: I don't know what %s is.\n", type);
	}
	else if (!info->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		Printf ("ACS: %s is not an inventory item.\n", type);
	}
	else if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->GiveInventory(static_cast<PClassInventory *>(info), amount);
		}
	}
	else
	{
		activator->GiveInventory(static_cast<PClassInventory *>(info), amount);
	}
}